

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O2

ArgumentsExpression * __thiscall
minja::Parser::parseCallArgs(ArgumentsExpression *__return_storage_ptr__,Parser *this)

{
  size_type sVar1;
  size_type sVar2;
  bool bVar3;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  *this_00;
  long lVar4;
  runtime_error *prVar5;
  allocator<char> local_99;
  ArgumentsExpression *local_98;
  shared_ptr<minja::Expression> expr;
  shared_ptr<minja::Expression> value;
  string local_50;
  
  local_98 = __return_storage_ptr__;
  consumeSpaces(this,Strip);
  std::__cxx11::string::string<std::allocator<char>>((string *)&value,"(",(allocator<char> *)&expr);
  consumeToken(&local_50,this,(string *)&value,Strip);
  sVar1 = local_50._M_string_length;
  std::__cxx11::string::~string((string *)&local_50);
  std::__cxx11::string::~string((string *)&value);
  if (sVar1 == 0) {
    prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(prVar5,"Expected opening parenthesis in call args");
    __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  (local_98->kwargs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (local_98->kwargs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_98->args).
  super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (local_98->kwargs).
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<minja::Expression>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->args).
  super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (local_98->args).
  super__Vector_base<std::shared_ptr<minja::Expression>,_std::allocator<std::shared_ptr<minja::Expression>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this_00 = &local_98->kwargs;
  bVar3 = false;
  do {
    if ((this->it)._M_current == (this->end)._M_current) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Expected closing parenthesis in call args");
      __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&value,")",(allocator<char> *)&expr);
    consumeToken(&local_50,this,(string *)&value,Strip);
    sVar1 = local_50._M_string_length;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&value);
    if (sVar1 != 0) {
      return local_98;
    }
    parseExpression((Parser *)&expr,SUB81(this,0));
    if (expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar5,"Expected expression in call args");
      goto LAB_001a87cd;
    }
    lVar4 = __dynamic_cast(expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                           _M_ptr,&Expression::typeinfo,&VariableExpr::typeinfo,0);
    if (lVar4 == 0) {
LAB_001a8662:
      std::
      vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
      ::emplace_back<std::shared_ptr<minja::Expression>>
                ((vector<std::shared_ptr<minja::Expression>,std::allocator<std::shared_ptr<minja::Expression>>>
                  *)local_98,&expr);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>((string *)&value,"=",&local_99);
      consumeToken(&local_50,this,(string *)&value,Strip);
      sVar1 = local_50._M_string_length;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&value);
      if (sVar1 == 0) goto LAB_001a8662;
      parseExpression((Parser *)&value,SUB81(this,0));
      if (value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
          (element_type *)0x0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected expression in for named arg");
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      std::__cxx11::string::string((string *)&local_50,(string *)(lVar4 + 0x20));
      std::
      vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
      ::emplace_back<std::__cxx11::string,std::shared_ptr<minja::Expression>>
                ((vector<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>,std::allocator<std::pair<std::__cxx11::string,std::shared_ptr<minja::Expression>>>>
                  *)this_00,&local_50,&value);
      std::__cxx11::string::~string((string *)&local_50);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&value.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)&value,",",&local_99);
    consumeToken(&local_50,this,(string *)&value,Strip);
    sVar1 = local_50._M_string_length;
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&value);
    if (sVar1 == 0) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&value,")",&local_99);
      consumeToken(&local_50,this,(string *)&value,Strip);
      sVar2 = local_50._M_string_length;
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&value);
      bVar3 = true;
      if (sVar2 == 0) {
        prVar5 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar5,"Expected closing parenthesis in call args");
LAB_001a87cd:
        __cxa_throw(prVar5,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&expr.super___shared_ptr<minja::Expression,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    if (sVar1 == 0) {
      if (!bVar3) {
        ArgumentsExpression::~ArgumentsExpression(local_98);
      }
      return local_98;
    }
  } while( true );
}

Assistant:

ArgumentsExpression parseCallArgs() {
        consumeSpaces();
        if (consumeToken("(").empty()) throw std::runtime_error("Expected opening parenthesis in call args");

        ArgumentsExpression result;

        while (it != end) {
            if (!consumeToken(")").empty()) {
                return result;
            }
            auto expr = parseExpression();
            if (!expr) throw std::runtime_error("Expected expression in call args");

            if (auto ident = dynamic_cast<VariableExpr*>(expr.get())) {
                if (!consumeToken("=").empty()) {
                    auto value = parseExpression();
                    if (!value) throw std::runtime_error("Expected expression in for named arg");
                    result.kwargs.emplace_back(ident->get_name(), std::move(value));
                } else {
                    result.args.emplace_back(std::move(expr));
                }
            } else {
                result.args.emplace_back(std::move(expr));
            }
            if (consumeToken(",").empty()) {
              if (consumeToken(")").empty()) {
                throw std::runtime_error("Expected closing parenthesis in call args");
              }
              return result;
            }
        }
        throw std::runtime_error("Expected closing parenthesis in call args");
    }